

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawSlabPalCommand::Execute(DrawSlabPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  int core_skip;
  int iVar7;
  int iVar8;
  int pass_skip;
  uint uVar9;
  int iVar10;
  uint8_t *__s;
  
  iVar6 = this->_start_y;
  iVar10 = thread->pass_end_y - iVar6;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (this->_dy < iVar10) {
    iVar10 = this->_dy;
  }
  uVar9 = thread->pass_start_y - iVar6;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  iVar1 = thread->num_cores;
  iVar7 = (iVar1 - (int)((iVar6 + uVar9) - thread->core) % iVar1) % iVar1;
  iVar6 = (int)((~uVar9 + iVar1 + iVar10) - iVar7) / iVar1;
  if (0 < iVar6) {
    puVar4 = this->_colormap;
    puVar5 = this->_vvptr;
    iVar10 = this->_vi;
    uVar2 = *(uint *)&(this->super_PalSpanCommand).field_0x64;
    iVar3 = this->_pitch;
    iVar7 = iVar7 + uVar9;
    iVar8 = iVar10 * iVar7 + this->_v;
    __s = this->_p + iVar7 * iVar3;
    iVar6 = iVar6 + 1;
    do {
      if (0 < (int)uVar2) {
        memset(__s,(uint)puVar4[puVar5[iVar8 >> 0x10]],(ulong)uVar2);
      }
      __s = __s + iVar1 * iVar3;
      iVar8 = iVar8 + iVar1 * iVar10;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

void DrawSlabPalCommand::Execute(DrawerThread *thread)
	{
		int count = _dy;
		uint8_t *dest = _p;
		int pitch = _pitch;
		int width = _dx;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _vvptr;
		fixed_t fracpos = _v;
		fixed_t iscale = _vi;

		count = thread->count_for_thread(_start_y, count);
		dest = thread->dest_for_thread(_start_y, pitch, dest);
		fracpos += iscale * thread->skipped_by_thread(_start_y);
		iscale *= thread->num_cores;
		pitch *= thread->num_cores;

		while (count > 0)
		{
			uint8_t color = colormap[source[fracpos >> FRACBITS]];

			for (int x = 0; x < width; x++)
				dest[x] = color;

			dest += pitch;
			fracpos += iscale;
			count--;
		}
	}